

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq_variance.c
# Opt level: O1

int av1_block_wavelet_energy_level(AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bs)

{
  int iVar1;
  int64_t iVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  
  if ((cpi->oxcf).pass < AOM_RC_LAST_PASS) {
    dVar4 = 10.0;
  }
  else {
    dVar4 = (cpi->twopass_frame).frame_avg_haar_energy;
  }
  iVar2 = av1_haar_ac_sad_mxn_uint8_input
                    (x->plane[0].src.buf,x->plane[0].src.stride,
                     (uint)((x->e_mbd).cur_buf)->flags >> 3 & 1,(uint)(block_size_high[bs] >> 3),
                     (uint)(block_size_wide[bs] >> 3));
  dVar5 = log1p((double)((uint)((int)iVar2 << 8) >>
                        ("\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[bs] & 0x1f)));
  dVar4 = round(dVar5 - dVar4);
  iVar3 = 1;
  if ((int)dVar4 < 1) {
    iVar3 = (int)dVar4;
  }
  iVar1 = -4;
  if (-4 < iVar3) {
    iVar1 = iVar3;
  }
  return iVar1;
}

Assistant:

int av1_block_wavelet_energy_level(const AV1_COMP *cpi, const MACROBLOCK *x,
                                   BLOCK_SIZE bs) {
  double energy, energy_midpoint;
  energy_midpoint = (is_stat_consumption_stage_twopass(cpi))
                        ? cpi->twopass_frame.frame_avg_haar_energy
                        : DEFAULT_E_MIDPOINT;
  energy = log_block_wavelet_energy(x, bs) - energy_midpoint;
  return clamp((int)round(energy), ENERGY_MIN, ENERGY_MAX);
}